

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

Data * __thiscall
QTzTimeZonePrivate::nextTransition
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 afterMSecsSinceEpoch)

{
  QTzTransitionRule *pQVar1;
  undefined4 uVar2;
  long lVar3;
  Data *pDVar4;
  QTzTransitionRule *pQVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  int iVar9;
  int iVar10;
  Data *pDVar11;
  QTzTransitionTime *pQVar12;
  QTzTransitionTime *pQVar13;
  undefined1 *puVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QTzTransitionRule rule;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->cached_data).m_posixRule.d.size == 0) ||
     ((lVar3 = (this->cached_data).m_tranTimes.d.size, lVar3 != 0 &&
      (afterMSecsSinceEpoch <= (this->cached_data).m_tranTimes.d.ptr[lVar3 + -1].atMSecsSinceEpoch))
     )) {
    pQVar12 = (this->cached_data).m_tranTimes.d.ptr;
    uVar15 = (this->cached_data).m_tranTimes.d.size;
    pQVar13 = pQVar12 + uVar15;
    while (uVar7 = uVar15, 0 < (long)uVar7) {
      uVar15 = uVar7 >> 1;
      if (pQVar12[uVar15].atMSecsSinceEpoch <= afterMSecsSinceEpoch) {
        pQVar12 = pQVar12 + uVar15 + 1;
        uVar15 = ~uVar15 + uVar7;
      }
    }
    if (pQVar12 != pQVar13) {
      pQVar5 = (this->cached_data).m_tranRules.d.ptr;
      pQVar1 = pQVar5 + pQVar12->ruleIndex;
      uVar2 = pQVar1->stdOffset;
      uVar6 = pQVar1->dstOffset;
      rule.dstOffset = uVar6;
      rule.stdOffset = uVar2;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        rule.abbreviationIndex = pQVar5[pQVar12->ruleIndex].abbreviationIndex;
        rule._9_3_ = 0;
        dataFromRule(__return_storage_ptr__,this,rule,pQVar12->atMSecsSinceEpoch);
        return __return_storage_ptr__;
      }
      goto LAB_0040c1e9;
    }
    (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
    (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->abbreviation).d.size = 0;
    __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
    __return_storage_ptr__->offsetFromUtc = -0x80000000;
    __return_storage_ptr__->standardTimeOffset = -0x80000000;
    __return_storage_ptr__->daylightTimeOffset = -0x80000000;
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,afterMSecsSinceEpoch);
    pDVar11 = local_48.ptr;
    puVar14 = (undefined1 *)local_48.size;
    while (puVar8 = puVar14, 0 < (long)puVar8) {
      puVar14 = (undefined1 *)((ulong)puVar8 >> 1);
      if (pDVar11[(long)puVar14].atMSecsSinceEpoch <= afterMSecsSinceEpoch) {
        pDVar11 = pDVar11 + (long)(puVar14 + 1);
        puVar14 = puVar8 + ~(ulong)puVar14;
      }
    }
    if (pDVar11 == local_48.ptr + local_48.size) {
      (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->abbreviation).d.size = 0;
      __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
      __return_storage_ptr__->offsetFromUtc = -0x80000000;
      __return_storage_ptr__->standardTimeOffset = -0x80000000;
      __return_storage_ptr__->daylightTimeOffset = -0x80000000;
    }
    else {
      pDVar4 = (pDVar11->abbreviation).d.d;
      (__return_storage_ptr__->abbreviation).d.d = pDVar4;
      (__return_storage_ptr__->abbreviation).d.ptr = (pDVar11->abbreviation).d.ptr;
      (__return_storage_ptr__->abbreviation).d.size = (pDVar11->abbreviation).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      __return_storage_ptr__->daylightTimeOffset = pDVar11->daylightTimeOffset;
      iVar9 = pDVar11->offsetFromUtc;
      iVar10 = pDVar11->standardTimeOffset;
      __return_storage_ptr__->atMSecsSinceEpoch = pDVar11->atMSecsSinceEpoch;
      __return_storage_ptr__->offsetFromUtc = iVar9;
      __return_storage_ptr__->standardTimeOffset = iVar10;
    }
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0040c1e9:
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::nextTransition(qint64 afterMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < afterMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(afterMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [afterMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                       });

        return it == posixTrans.cend() ? Data{} : *it;
    }

    // Otherwise, if we can find a valid tran, use its rule:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [afterMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= afterMSecsSinceEpoch;
                                     });
    return last != tranCache().cend() ? dataForTzTransition(*last) : Data{};
}